

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TCPConnector.cpp
# Opt level: O2

void __thiscall hwnet::TCPConnector::~TCPConnector(TCPConnector *this)

{
  undefined1 local_28 [8];
  shared_ptr<hwnet::util::Timer> sp;
  
  (this->super_Task)._vptr_Task = (_func_int **)&PTR_Do_0012ac80;
  (this->super_Channel)._vptr_Channel = (_func_int **)&PTR_OnActive_0012acb8;
  std::__shared_ptr<hwnet::util::Timer,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<hwnet::util::Timer,_(__gnu_cxx::_Lock_policy)2> *)local_28,
             &this->connectTimer);
  if (local_28 != (undefined1  [8])0x0) {
    util::Timer::cancel((Timer *)local_28);
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&sp);
  std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count
            (&(this->connectTimer).super___weak_ptr<hwnet::util::Timer,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::_Function_base::~_Function_base(&(this->errorCallback_).super__Function_base);
  std::_Function_base::~_Function_base(&(this->connectCallback_).super__Function_base);
  std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count
            (&(this->super_enable_shared_from_this<hwnet::TCPConnector>)._M_weak_this.
              super___weak_ptr<hwnet::TCPConnector,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return;
}

Assistant:

TCPConnector::~TCPConnector() {
	if(auto sp = this->connectTimer.lock()) {
		sp->cancel();
	}
}